

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O3

TSymbol * __thiscall
glslang::TParseContext::redeclareBuiltinVariable
          (TParseContext *this,TSourceLoc *loc,TString *identifier,TQualifier *qualifier,
          TShaderQualifiers *publicType)

{
  EShLanguage EVar1;
  TLayoutDepth TVar2;
  TLayoutStencil TVar3;
  TSymbolTable *pTVar4;
  bool bVar5;
  bool bVar6;
  char cVar7;
  int iVar8;
  undefined4 extraout_var;
  long lVar9;
  const_iterator cVar10;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  ulong uVar11;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  ulong uVar12;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  TIntermediate *pTVar13;
  undefined4 extraout_var_14;
  ulong uVar14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  char *pcVar15;
  byte bVar16;
  TSourceLoc *pTVar17;
  undefined8 uVar18;
  _func_int **pp_Var19;
  TShaderQualifiers *pTVar20;
  bool builtIn;
  TSymbol *symbol;
  bool local_79;
  TSymbol *local_78;
  TShaderQualifiers *local_70;
  TSourceLoc *local_68;
  pool_allocator<char> local_60;
  key_type local_58;
  
  iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(identifier,0,3,"gl_");
  if (iVar8 != 0) {
    return (TSymbol *)0x0;
  }
  pTVar4 = (this->super_TParseContextBase).symbolTable;
  if (((long)(pTVar4->table).
             super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(pTVar4->table).
             super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
             ._M_impl.super__Vector_impl_data._M_start & 0x7fffffff8U) != 0x20) {
    return (TSymbol *)0x0;
  }
  local_70 = publicType;
  local_68 = loc;
  if ((this->super_TParseContextBase).super_TParseVersions.profile == EEsProfile) {
    bVar6 = false;
LAB_004b04ec:
    bVar16 = 1;
    if ((this->super_TParseContextBase).super_TParseVersions.version < 0x140) {
      iVar8 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[9])
                        (this,2,AEP_shader_io_blocks);
      bVar16 = (byte)iVar8;
LAB_004b0548:
      if ((bVar6 | bVar16) != 1) {
        return (TSymbol *)0x0;
      }
      goto LAB_004b0556;
    }
LAB_004b05dd:
    iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(identifier,"gl_FragDepth");
    if ((((((iVar8 != 0) ||
           ((0x1a3 < (this->super_TParseContextBase).super_TParseVersions.version & bVar6) == 0 &&
            bVar16 == 0)) &&
          ((iVar8 = std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                    compare(identifier,"gl_FragCoord"), iVar8 != 0 ||
           (bVar16 == 0 &&
            (0x8b < (this->super_TParseContextBase).super_TParseVersions.version & bVar6) == 0))))
         && ((((((iVar8 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          ::compare(identifier,"gl_ClipDistance"), iVar8 != 0 &&
                 (iVar8 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          ::compare(identifier,"gl_CullDistance"), iVar8 != 0)) &&
                (iVar8 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         ::compare(identifier,"gl_ShadingRateEXT"), iVar8 != 0)) &&
               ((iVar8 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         ::compare(identifier,"gl_PrimitiveShadingRateEXT"), iVar8 != 0 &&
                (iVar8 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         ::compare(identifier,"gl_FrontColor"), iVar8 != 0)))) &&
              (iVar8 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                       compare(identifier,"gl_BackColor"), iVar8 != 0)) &&
             (((iVar8 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                        compare(identifier,"gl_FrontSecondaryColor"), iVar8 != 0 &&
               (iVar8 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                        compare(identifier,"gl_BackSecondaryColor"), iVar8 != 0)) &&
              ((iVar8 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                        compare(identifier,"gl_SecondaryColor"), iVar8 != 0 &&
               ((iVar8 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         ::compare(identifier,"gl_Color"), iVar8 != 0 ||
                ((this->super_TParseContextBase).super_TParseVersions.language != EShLangFragment)))
               ))))))) &&
        ((iVar8 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                  compare(identifier,"gl_FragStencilRefARB"), bVar6 != true || iVar8 != 0 ||
         (((this->super_TParseContextBase).super_TParseVersions.version < 0x8c ||
          ((this->super_TParseContextBase).super_TParseVersions.language != EShLangFragment)))))) &&
       (((iVar8 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                  compare(identifier,"gl_SampleMask"), iVar8 != 0 &&
         (((iVar8 = std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                    compare(identifier,"gl_Layer"), iVar8 != 0 &&
           (iVar8 = std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                    compare(identifier,"gl_PrimitiveIndicesNV"), iVar8 != 0)) &&
          (iVar8 = std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                   compare(identifier,"gl_PrimitivePointIndicesEXT"), iVar8 != 0)))) &&
        (((iVar8 = std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                   compare(identifier,"gl_PrimitiveLineIndicesEXT"), iVar8 != 0 &&
          (iVar8 = std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                   compare(identifier,"gl_PrimitiveTriangleIndicesEXT"), iVar8 != 0)) &&
         (iVar8 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                  compare(identifier,"gl_TexCoord"), iVar8 != 0)))))) {
      return (TSymbol *)0x0;
    }
    bVar5 = false;
  }
  else {
    if ((this->super_TParseContextBase).super_TParseVersions.version < 0x82) {
      iVar8 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (identifier,"gl_TexCoord");
      bVar6 = iVar8 == 0;
      if ((this->super_TParseContextBase).super_TParseVersions.profile == EEsProfile)
      goto LAB_004b04ec;
      bVar16 = 0;
      goto LAB_004b0548;
    }
    bVar6 = true;
    bVar16 = 0;
LAB_004b0556:
    if ((((this->super_TParseContextBase).super_TParseVersions.profile == EEsProfile) ||
        (0x8c < (this->super_TParseContextBase).super_TParseVersions.version)) ||
       (iVar8 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                          (this,"GL_ARB_separate_shader_objects"), (char)iVar8 == '\0'))
    goto LAB_004b05dd;
    iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(identifier,"gl_Position");
    bVar5 = true;
    if (((iVar8 != 0) &&
        (iVar8 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                           (identifier,"gl_PointSize"), iVar8 != 0)) &&
       ((iVar8 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                           (identifier,"gl_ClipVertex"), iVar8 != 0 &&
        (iVar8 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                           (identifier,"gl_FogFragCoord"), iVar8 != 0)))) goto LAB_004b05dd;
  }
  local_78 = TSymbolTable::find((this->super_TParseContextBase).symbolTable,identifier,&local_79,
                                (bool *)0x0,(int *)0x0);
  if (local_78 == (TSymbol *)0x0) {
    return (TSymbol *)0x0;
  }
  if (local_79 == true) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x4e])
              (this,&local_78);
    TSymbolTable::amendSymbolIdLevel((this->super_TParseContextBase).symbolTable,local_78);
  }
  iVar8 = (*local_78->_vptr_TSymbol[0xd])(local_78);
  lVar9 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar8) + 0x50))
                    ((long *)CONCAT44(extraout_var,iVar8));
  pTVar20 = local_70;
  if (bVar5) {
    pTVar13 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    cVar10 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
             ::find(&(pTVar13->ioAccessed)._M_t,identifier);
    pTVar17 = local_68;
    if ((_Rb_tree_header *)cVar10._M_node !=
        &(pTVar13->ioAccessed)._M_t._M_impl.super__Rb_tree_header) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,local_68,"cannot redeclare after use",(identifier->_M_dataplus)._M_p,"");
    }
    bVar6 = TQualifier::hasNonXfbLayout(qualifier);
    if ((bVar6) || (((uint)*(undefined8 *)&qualifier->field_0x24 & 0x7fffffff) != 0x7fffffff)) {
      iVar8 = (*local_78->_vptr_TSymbol[3])();
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar17,"cannot apply layout qualifier to","redeclaration",
                 *(undefined8 *)(CONCAT44(extraout_var_00,iVar8) + 8));
    }
    uVar14 = *(ulong *)&qualifier->field_0x8;
    if ((uVar14 & 0x3fff18020000000) == 0) {
      EVar1 = (this->super_TParseContextBase).super_TParseVersions.language;
      if (EVar1 == EShLangFragment) {
        if (((uint)uVar14 & 0x7f) != 3) goto LAB_004b08fb;
      }
      else if ((EVar1 == EShLangVertex) && (((uint)uVar14 & 0x7f) != 4)) goto LAB_004b08fb;
    }
    else {
LAB_004b08fb:
      iVar8 = (*local_78->_vptr_TSymbol[3])();
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar17,"cannot change storage, memory, or auxiliary qualification of",
                 "redeclaration",*(undefined8 *)(CONCAT44(extraout_var_01,iVar8) + 8));
      uVar14 = *(ulong *)&qualifier->field_0x8;
    }
    if (((uint)uVar14 >> 0x1e & 1) != 0) {
      return local_78;
    }
    iVar8 = (*local_78->_vptr_TSymbol[3])();
    uVar18 = *(undefined8 *)(CONCAT44(extraout_var_02,iVar8) + 8);
    pp_Var19 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar15 = "cannot change interpolation qualification of";
    goto LAB_004b0c12;
  }
  iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(identifier,"gl_FrontColor");
  pTVar17 = local_68;
  if ((((iVar8 == 0) ||
       (iVar8 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                          (identifier,"gl_BackColor"), iVar8 == 0)) ||
      (iVar8 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                         (identifier,"gl_FrontSecondaryColor"), iVar8 == 0)) ||
     (((iVar8 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                          (identifier,"gl_BackSecondaryColor"), iVar8 == 0 ||
       (iVar8 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                          (identifier,"gl_SecondaryColor"), iVar8 == 0)) ||
      (iVar8 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                         (identifier,"gl_Color"), iVar8 == 0)))) {
    uVar12 = (ulong)((uint)*(undefined8 *)&qualifier->field_0x8 & 0x80000000);
    uVar14 = *(ulong *)(lVar9 + 8);
    *(ulong *)(lVar9 + 8) = uVar14 & 0xffffffff7fffffff | uVar12;
    uVar11 = (ulong)((uint)*(undefined8 *)&qualifier->field_0x8 & 0x40000000);
    *(ulong *)(lVar9 + 8) = uVar14 & 0xffffffff3fffffff | uVar12 | uVar11;
    *(ulong *)(lVar9 + 8) =
         uVar14 & 0xffffffdf3fffffff | uVar12 | uVar11 |
         *(ulong *)&qualifier->field_0x8 & 0x2000000000;
    bVar6 = TQualifier::hasNonXfbLayout(qualifier);
    if ((bVar6) || (((uint)*(undefined8 *)&qualifier->field_0x24 & 0x7fffffff) != 0x7fffffff)) {
      iVar8 = (*local_78->_vptr_TSymbol[3])();
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar17,"cannot apply layout qualifier to","redeclaration",
                 *(undefined8 *)(CONCAT44(extraout_var_04,iVar8) + 8));
    }
    if ((*(ulong *)&qualifier->field_0x8 & 0x3fff18020000000) == 0) {
      iVar8 = (*local_78->_vptr_TSymbol[0xc])();
      lVar9 = (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar8) + 0x58))
                        ((long *)CONCAT44(extraout_var_05,iVar8));
      if (((*(uint *)&qualifier->field_0x8 ^ *(uint *)(lVar9 + 8)) & 0x7f) == 0) {
        return local_78;
      }
    }
    iVar8 = (*local_78->_vptr_TSymbol[3])();
    uVar18 = *(undefined8 *)(CONCAT44(extraout_var_06,iVar8) + 8);
    pp_Var19 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar15 = "cannot change storage, memory, or auxiliary qualification of";
    goto LAB_004b0c12;
  }
  iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(identifier,"gl_TexCoord");
  if (((iVar8 == 0) ||
      (iVar8 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                         (identifier,"gl_ClipDistance"), iVar8 == 0)) ||
     (iVar8 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (identifier,"gl_CullDistance"), iVar8 == 0)) {
    bVar6 = TQualifier::hasNonXfbLayout(qualifier);
    if (((!bVar6) && (((uint)*(undefined8 *)&qualifier->field_0x24 & 0x7fffffff) == 0x7fffffff)) &&
       (uVar14 = *(ulong *)&qualifier->field_0x8, (uVar14 & 0x3fff18020000000) == 0)) {
      uVar12 = *(ulong *)(lVar9 + 8) ^ uVar14;
      if (((uVar12 >> 0x25 & 1) == 0) &&
         (-1 < (int)*(ulong *)(lVar9 + 8) != (int)uVar14 < 0 && (uVar12 & 0x7f) == 0)) {
        return local_78;
      }
    }
    iVar8 = (*local_78->_vptr_TSymbol[3])();
    uVar18 = *(undefined8 *)(CONCAT44(extraout_var_07,iVar8) + 8);
    pp_Var19 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar15 = "cannot change qualification of";
    goto LAB_004b0c12;
  }
  iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(identifier,"gl_FragCoord");
  if (iVar8 == 0) {
    pTVar13 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    pTVar20 = local_70;
    if (pTVar13->texCoordBuiltinRedeclared != true) {
      local_60.allocator = GetThreadPoolAllocator();
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_58,"gl_FragCoord",&local_60);
      cVar10 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
               ::find(&(pTVar13->ioAccessed)._M_t,&local_58);
      pTVar20 = local_70;
      if ((_Rb_tree_header *)cVar10._M_node !=
          &(pTVar13->ioAccessed)._M_t._M_impl.super__Rb_tree_header) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,pTVar17,"cannot redeclare after use","gl_FragCoord","");
      }
    }
    uVar14 = *(ulong *)&qualifier->field_0x8;
    if (((*(ulong *)(lVar9 + 8) ^ uVar14) >> 0x25 & 1) == 0) {
      if (((uVar14 & 0x3fff18020000000) == 0) && ((int)uVar14 < 0 == (int)*(ulong *)(lVar9 + 8) < 0)
         ) goto LAB_004b0f16;
    }
    iVar8 = (*local_78->_vptr_TSymbol[3])();
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,pTVar17,"can only change layout qualification of","redeclaration",
               *(undefined8 *)(CONCAT44(extraout_var_11,iVar8) + 8));
    uVar14 = *(ulong *)&qualifier->field_0x8;
LAB_004b0f16:
    if (((uint)uVar14 & 0x7f) != 3) {
      iVar8 = (*local_78->_vptr_TSymbol[3])();
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar17,"cannot change input storage qualification of","redeclaration",
                 *(undefined8 *)(CONCAT44(extraout_var_12,iVar8) + 8));
    }
    pTVar13 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    if ((local_79 == false) &&
       ((pTVar20->pixelCenterInteger != pTVar13->pixelCenterInteger ||
        (pTVar20->originUpperLeft != pTVar13->originUpperLeft)))) {
      iVar8 = (*local_78->_vptr_TSymbol[3])();
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar17,"cannot redeclare with different qualification:","redeclaration",
                 *(undefined8 *)(CONCAT44(extraout_var_13,iVar8) + 8));
      pTVar13 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    }
    pTVar13->texCoordBuiltinRedeclared = true;
    if (pTVar20->pixelCenterInteger == true) {
      pTVar13->pixelCenterInteger = true;
    }
    if (pTVar20->originUpperLeft == true) {
      pTVar13->originUpperLeft = true;
      return local_78;
    }
    return local_78;
  }
  iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(identifier,"gl_FragDepth");
  if (iVar8 != 0) {
    iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(identifier,"gl_FragStencilRefARB");
    if (iVar8 != 0) {
      iVar8 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (identifier,"gl_PrimitiveIndicesNV");
      if (iVar8 != 0) {
        iVar8 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                          (identifier,"gl_SampleMask");
        if (iVar8 == 0) {
          if (pTVar20->layoutOverrideCoverage == false) {
            iVar8 = (*local_78->_vptr_TSymbol[3])();
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,pTVar17,"redeclaration only allowed for override_coverage layout",
                       "redeclaration",*(undefined8 *)(CONCAT44(extraout_var_19,iVar8) + 8));
          }
          ((this->super_TParseContextBase).super_TParseVersions.intermediate)->
          layoutOverrideCoverage = true;
          return local_78;
        }
        iVar8 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                          (identifier,"gl_Layer");
        if (iVar8 == 0) {
          cVar7 = qualifier->layoutViewportRelative;
          iVar8 = qualifier->layoutSecondaryViewportRelativeOffset;
          if (iVar8 == -0x800 && (bool)cVar7 == false) {
            iVar8 = (*local_78->_vptr_TSymbol[3])();
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,pTVar17,
                       "redeclaration only allowed for viewport_relative or secondary_view_offset layout"
                       ,"redeclaration",*(undefined8 *)(CONCAT44(extraout_var_03,iVar8) + 8));
            cVar7 = qualifier->layoutViewportRelative;
            iVar8 = qualifier->layoutSecondaryViewportRelativeOffset;
          }
          *(char *)(lVar9 + 0x30) = cVar7;
          *(int *)(lVar9 + 0x34) = iVar8;
          return local_78;
        }
        return local_78;
      }
      bVar6 = TQualifier::hasNonXfbLayout(qualifier);
      if ((bVar6) || (((uint)*(undefined8 *)&qualifier->field_0x24 & 0x7fffffff) != 0x7fffffff)) {
        iVar8 = (*local_78->_vptr_TSymbol[3])();
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,pTVar17,"cannot apply layout qualifier to","redeclaration",
                   *(undefined8 *)(CONCAT44(extraout_var_17,iVar8) + 8));
      }
      if ((*(uint *)&qualifier->field_0x8 & 0x7f) == 4) {
        return local_78;
      }
      iVar8 = (*local_78->_vptr_TSymbol[3])();
      uVar18 = *(undefined8 *)(CONCAT44(extraout_var_18,iVar8) + 8);
      pp_Var19 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar15 = "cannot change output storage qualification of";
      goto LAB_004b0c12;
    }
    uVar14 = *(ulong *)&qualifier->field_0x8;
    if (((*(ulong *)(lVar9 + 8) ^ uVar14) >> 0x25 & 1) == 0) {
      if (((uVar14 & 0x3fff18020000000) != 0) || ((int)uVar14 < 0 != (int)*(ulong *)(lVar9 + 8) < 0)
         ) goto LAB_004b1001;
    }
    else {
LAB_004b1001:
      iVar8 = (*local_78->_vptr_TSymbol[3])();
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar17,"can only change layout qualification of","redeclaration",
                 *(undefined8 *)(CONCAT44(extraout_var_14,iVar8) + 8));
      uVar14 = *(ulong *)&qualifier->field_0x8;
    }
    if (((uint)uVar14 & 0x7f) != 4) {
      iVar8 = (*local_78->_vptr_TSymbol[3])();
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar17,"cannot change output storage qualification of","redeclaration",
                 *(undefined8 *)(CONCAT44(extraout_var_15,iVar8) + 8));
    }
    if (local_70->layoutStencil == ElsNone) {
      return local_78;
    }
    pTVar13 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    local_60.allocator = GetThreadPoolAllocator();
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    basic_string<glslang::std::allocator<char>>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_58,
               "gl_FragStencilRefARB",&local_60);
    cVar10 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
             ::find(&(pTVar13->ioAccessed)._M_t,&local_58);
    if ((_Rb_tree_header *)cVar10._M_node !=
        &(pTVar13->ioAccessed)._M_t._M_impl.super__Rb_tree_header) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar17,"cannot redeclare after use","gl_FragStencilRefARB","");
    }
    pTVar13 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    TVar3 = pTVar13->stencilLayout;
    if (TVar3 == ElsNone) {
      pTVar13->stencilLayout = local_70->layoutStencil;
      return local_78;
    }
    if (TVar3 == local_70->layoutStencil) {
      return local_78;
    }
    iVar8 = (*local_78->_vptr_TSymbol[3])();
    uVar18 = *(undefined8 *)(CONCAT44(extraout_var_16,iVar8) + 8);
    pp_Var19 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar15 = "all redeclarations must use the same stencil layout on";
    goto LAB_004b0c12;
  }
  uVar14 = *(ulong *)&qualifier->field_0x8;
  if (((*(ulong *)(lVar9 + 8) ^ uVar14) >> 0x25 & 1) == 0) {
    if (((uVar14 & 0x3fff18020000000) != 0) || ((int)uVar14 < 0 != (int)*(ulong *)(lVar9 + 8) < 0))
    goto LAB_004b0d2d;
  }
  else {
LAB_004b0d2d:
    iVar8 = (*local_78->_vptr_TSymbol[3])();
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,pTVar17,"can only change layout qualification of","redeclaration",
               *(undefined8 *)(CONCAT44(extraout_var_08,iVar8) + 8));
    uVar14 = *(ulong *)&qualifier->field_0x8;
  }
  if (((uint)uVar14 & 0x7f) != 4) {
    iVar8 = (*local_78->_vptr_TSymbol[3])();
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,pTVar17,"cannot change output storage qualification of","redeclaration",
               *(undefined8 *)(CONCAT44(extraout_var_09,iVar8) + 8));
  }
  if (pTVar20->layoutDepth == EldNone) {
    return local_78;
  }
  pTVar13 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
  local_60.allocator = GetThreadPoolAllocator();
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_58,
             "gl_FragDepth",&local_60);
  cVar10 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
           ::find(&(pTVar13->ioAccessed)._M_t,&local_58);
  if ((_Rb_tree_header *)cVar10._M_node != &(pTVar13->ioAccessed)._M_t._M_impl.super__Rb_tree_header
     ) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,pTVar17,"cannot redeclare after use","gl_FragDepth","");
  }
  pTVar13 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
  TVar2 = pTVar13->depthLayout;
  if (TVar2 == EldNone) {
    pTVar13->depthLayout = local_70->layoutDepth;
    return local_78;
  }
  if (TVar2 == local_70->layoutDepth) {
    return local_78;
  }
  iVar8 = (*local_78->_vptr_TSymbol[3])();
  uVar18 = *(undefined8 *)(CONCAT44(extraout_var_10,iVar8) + 8);
  pp_Var19 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
  pcVar15 = "all redeclarations must use the same depth layout on";
LAB_004b0c12:
  (*pp_Var19[0x2d])(this,pTVar17,pcVar15,"redeclaration",uVar18);
  return local_78;
}

Assistant:

TSymbol* TParseContext::redeclareBuiltinVariable(const TSourceLoc& loc, const TString& identifier,
                                                 const TQualifier& qualifier, const TShaderQualifiers& publicType)
{
    if (! builtInName(identifier) || symbolTable.atBuiltInLevel() || ! symbolTable.atGlobalLevel())
        return nullptr;

    bool nonEsRedecls = (!isEsProfile() && (version >= 130 || identifier == "gl_TexCoord"));
    bool    esRedecls = (isEsProfile() &&
                         (version >= 320 || extensionsTurnedOn(Num_AEP_shader_io_blocks, AEP_shader_io_blocks)));
    if (! esRedecls && ! nonEsRedecls)
        return nullptr;

    // Special case when using GL_ARB_separate_shader_objects
    bool ssoPre150 = false;  // means the only reason this variable is redeclared is due to this combination
    if (!isEsProfile() && version <= 140 && extensionTurnedOn(E_GL_ARB_separate_shader_objects)) {
        if (identifier == "gl_Position"     ||
            identifier == "gl_PointSize"    ||
            identifier == "gl_ClipVertex"   ||
            identifier == "gl_FogFragCoord")
            ssoPre150 = true;
    }

    // Potentially redeclaring a built-in variable...

    if (ssoPre150 ||
        (identifier == "gl_FragDepth"           && ((nonEsRedecls && version >= 420) || esRedecls)) ||
        (identifier == "gl_FragCoord"           && ((nonEsRedecls && version >= 140) || esRedecls)) ||
         identifier == "gl_ClipDistance"                                                            ||
         identifier == "gl_CullDistance"                                                            ||
         identifier == "gl_ShadingRateEXT"                                                          ||
         identifier == "gl_PrimitiveShadingRateEXT"                                                 ||
         identifier == "gl_FrontColor"                                                              ||
         identifier == "gl_BackColor"                                                               ||
         identifier == "gl_FrontSecondaryColor"                                                     ||
         identifier == "gl_BackSecondaryColor"                                                      ||
         identifier == "gl_SecondaryColor"                                                          ||
        (identifier == "gl_Color"               && language == EShLangFragment)                     ||
        (identifier == "gl_FragStencilRefARB"   && (nonEsRedecls && version >= 140)
                                                && language == EShLangFragment)                     ||
         identifier == "gl_SampleMask"                                                              ||
         identifier == "gl_Layer"                                                                   ||
         identifier == "gl_PrimitiveIndicesNV"                                                      ||
         identifier == "gl_PrimitivePointIndicesEXT"                                                ||
         identifier == "gl_PrimitiveLineIndicesEXT"                                                 ||
         identifier == "gl_PrimitiveTriangleIndicesEXT"                                             ||
         identifier == "gl_TexCoord") {

        // Find the existing symbol, if any.
        bool builtIn;
        TSymbol* symbol = symbolTable.find(identifier, &builtIn);

        // If the symbol was not found, this must be a version/profile/stage
        // that doesn't have it.
        if (! symbol)
            return nullptr;

        // If it wasn't at a built-in level, then it's already been redeclared;
        // that is, this is a redeclaration of a redeclaration; reuse that initial
        // redeclaration.  Otherwise, make the new one.
        if (builtIn) {
            makeEditable(symbol);
            symbolTable.amendSymbolIdLevel(*symbol);
        }

        // Now, modify the type of the copy, as per the type of the current redeclaration.

        TQualifier& symbolQualifier = symbol->getWritableType().getQualifier();
        if (ssoPre150) {
            if (intermediate.inIoAccessed(identifier))
                error(loc, "cannot redeclare after use", identifier.c_str(), "");
            if (qualifier.hasLayout())
                error(loc, "cannot apply layout qualifier to", "redeclaration", symbol->getName().c_str());
            if (qualifier.isMemory() || qualifier.isAuxiliary() || (language == EShLangVertex   && qualifier.storage != EvqVaryingOut) ||
                                                                   (language == EShLangFragment && qualifier.storage != EvqVaryingIn))
                error(loc, "cannot change storage, memory, or auxiliary qualification of", "redeclaration", symbol->getName().c_str());
            if (! qualifier.smooth)
                error(loc, "cannot change interpolation qualification of", "redeclaration", symbol->getName().c_str());
        } else if (identifier == "gl_FrontColor"          ||
                   identifier == "gl_BackColor"           ||
                   identifier == "gl_FrontSecondaryColor" ||
                   identifier == "gl_BackSecondaryColor"  ||
                   identifier == "gl_SecondaryColor"      ||
                   identifier == "gl_Color") {
            symbolQualifier.flat = qualifier.flat;
            symbolQualifier.smooth = qualifier.smooth;
            symbolQualifier.nopersp = qualifier.nopersp;
            if (qualifier.hasLayout())
                error(loc, "cannot apply layout qualifier to", "redeclaration", symbol->getName().c_str());
            if (qualifier.isMemory() || qualifier.isAuxiliary() || symbol->getType().getQualifier().storage != qualifier.storage)
                error(loc, "cannot change storage, memory, or auxiliary qualification of", "redeclaration", symbol->getName().c_str());
        } else if (identifier == "gl_TexCoord"     ||
                   identifier == "gl_ClipDistance" ||
                   identifier == "gl_CullDistance") {
            if (qualifier.hasLayout() || qualifier.isMemory() || qualifier.isAuxiliary() ||
                qualifier.nopersp != symbolQualifier.nopersp || qualifier.flat != symbolQualifier.flat ||
                symbolQualifier.storage != qualifier.storage)
                error(loc, "cannot change qualification of", "redeclaration", symbol->getName().c_str());
        } else if (identifier == "gl_FragCoord") {
            if (!intermediate.getTexCoordRedeclared() && intermediate.inIoAccessed("gl_FragCoord"))
                error(loc, "cannot redeclare after use", "gl_FragCoord", "");
            if (qualifier.nopersp != symbolQualifier.nopersp || qualifier.flat != symbolQualifier.flat ||
                qualifier.isMemory() || qualifier.isAuxiliary())
                error(loc, "can only change layout qualification of", "redeclaration", symbol->getName().c_str());
            if (qualifier.storage != EvqVaryingIn)
                error(loc, "cannot change input storage qualification of", "redeclaration", symbol->getName().c_str());
            if (! builtIn && (publicType.pixelCenterInteger != intermediate.getPixelCenterInteger() ||
                              publicType.originUpperLeft != intermediate.getOriginUpperLeft()))
                error(loc, "cannot redeclare with different qualification:", "redeclaration", symbol->getName().c_str());


            intermediate.setTexCoordRedeclared();
            if (publicType.pixelCenterInteger)
                intermediate.setPixelCenterInteger();
            if (publicType.originUpperLeft)
                intermediate.setOriginUpperLeft();
        } else if (identifier == "gl_FragDepth") {
            if (qualifier.nopersp != symbolQualifier.nopersp || qualifier.flat != symbolQualifier.flat ||
                qualifier.isMemory() || qualifier.isAuxiliary())
                error(loc, "can only change layout qualification of", "redeclaration", symbol->getName().c_str());
            if (qualifier.storage != EvqVaryingOut)
                error(loc, "cannot change output storage qualification of", "redeclaration", symbol->getName().c_str());
            if (publicType.layoutDepth != EldNone) {
                if (intermediate.inIoAccessed("gl_FragDepth"))
                    error(loc, "cannot redeclare after use", "gl_FragDepth", "");
                if (! intermediate.setDepth(publicType.layoutDepth))
                    error(loc, "all redeclarations must use the same depth layout on", "redeclaration", symbol->getName().c_str());
            }
        } else if (identifier == "gl_FragStencilRefARB") {
            if (qualifier.nopersp != symbolQualifier.nopersp || qualifier.flat != symbolQualifier.flat ||
                qualifier.isMemory() || qualifier.isAuxiliary())
                error(loc, "can only change layout qualification of", "redeclaration", symbol->getName().c_str());
            if (qualifier.storage != EvqVaryingOut)
                error(loc, "cannot change output storage qualification of", "redeclaration", symbol->getName().c_str());
            if (publicType.layoutStencil != ElsNone) {
                if (intermediate.inIoAccessed("gl_FragStencilRefARB"))
                    error(loc, "cannot redeclare after use", "gl_FragStencilRefARB", "");
                if (!intermediate.setStencil(publicType.layoutStencil))
                    error(loc, "all redeclarations must use the same stencil layout on", "redeclaration",
                          symbol->getName().c_str());
            }
        }
        else if (
            identifier == "gl_PrimitiveIndicesNV") {
            if (qualifier.hasLayout())
                error(loc, "cannot apply layout qualifier to", "redeclaration", symbol->getName().c_str());
            if (qualifier.storage != EvqVaryingOut)
                error(loc, "cannot change output storage qualification of", "redeclaration", symbol->getName().c_str());
        }
        else if (identifier == "gl_SampleMask") {
            if (!publicType.layoutOverrideCoverage) {
                error(loc, "redeclaration only allowed for override_coverage layout", "redeclaration", symbol->getName().c_str());
            }
            intermediate.setLayoutOverrideCoverage();
        }
        else if (identifier == "gl_Layer") {
            if (!qualifier.layoutViewportRelative && qualifier.layoutSecondaryViewportRelativeOffset == -2048)
                error(loc, "redeclaration only allowed for viewport_relative or secondary_view_offset layout", "redeclaration", symbol->getName().c_str());
            symbolQualifier.layoutViewportRelative = qualifier.layoutViewportRelative;
            symbolQualifier.layoutSecondaryViewportRelativeOffset = qualifier.layoutSecondaryViewportRelativeOffset;
        }

        // TODO: semantics quality: separate smooth from nothing declared, then use IsInterpolation for several tests above

        return symbol;
    }

    return nullptr;
}